

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86rapass.cpp
# Opt level: O3

Error __thiscall
asmjit::v1_14::x86::RACFGBuilder::onInvoke
          (RACFGBuilder *this,InvokeNode *invokeNode,RAInstBuilder *ib)

{
  byte bVar1;
  BaseBuilder *pBVar2;
  _func_int *p_Var3;
  BaseRAPass *this_00;
  Environment vReg;
  Operand_ *pOVar4;
  Error EVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  InstId IVar9;
  Environment vReg_00;
  long lVar10;
  Environment *out;
  undefined1 *puVar11;
  long unaff_R15;
  long lVar12;
  bool bVar13;
  RAWorkReg *workReg;
  RAWorkReg *pRStack_b8;
  Operand_ OStack_b0;
  Operand_ OStack_a0;
  RAInstBuilder *pRStack_88;
  Environment *pEStack_80;
  undefined1 *puStack_78;
  InvokeNode *pIStack_70;
  long lStack_68;
  ulong uStack_60;
  byte local_49;
  Environment local_48;
  RACFGBuilder *local_40;
  ulong local_38;
  
  local_38 = (ulong)(byte)invokeNode->field_0xf4;
  local_40 = this;
  if (local_38 != 0) {
    out = (Environment *)&invokeNode->field_0x11c;
    bVar13 = true;
    puVar11 = (undefined1 *)0x4;
    uVar8 = 0;
    vReg_00 = (Environment)invokeNode;
    do {
      if (uVar8 == 0x20) goto LAB_00148602;
      lVar12 = 0;
      local_49 = bVar13;
      do {
        uVar6 = *(uint *)(&out->_arch + lVar12);
        if (uVar6 != 0) {
          if ((byte)invokeNode->field_0xf4 <= (byte)uVar8) {
            uStack_60 = 0x1485e7;
            onInvoke();
LAB_001485e7:
            EVar5 = 0x1e;
            goto LAB_001484a1;
          }
          pOVar4 = invokeNode->_args->_data;
          if ((*(uint *)(puVar11 + (long)(pOVar4->_data + lVar12 + -3)) & 7) == 1) {
            this = *(RACFGBuilder **)local_40;
            pBVar2 = (((BaseRAPass *)this)->super_FuncPass).super_Pass._cb;
            if (*(uint *)&pBVar2[1].super_BaseEmitter._logger <=
                *(int *)(puVar11 + (long)(pOVar4->_data + lVar12 + -2)) - 0x100U) goto LAB_001485e7;
            vReg_00 = (&(pBVar2[1].super_BaseEmitter._code)->_environment)
                      [*(int *)(puVar11 + (long)(pOVar4->_data + lVar12 + -2)) - 0x100U];
            local_48 = *(Environment *)((long)vReg_00 + 0x28);
            if (local_48 == (Environment)0x0) {
              uStack_60 = 0x14840e;
              EVar5 = BaseRAPass::_asWorkReg
                                ((BaseRAPass *)this,(VirtReg *)vReg_00,(RAWorkReg **)&local_48);
              if (EVar5 != 0) goto LAB_001484a1;
              uVar6 = *(uint *)(&out->_arch + lVar12);
            }
            if ((uVar6 >> 10 & 1) != 0) {
              if ((*(byte *)((long)local_48 + 0x21) & 0xf) == 0) {
LAB_00148461:
                uStack_60 = 0x14846f;
                vReg_00 = local_48;
                this = (RACFGBuilder *)ib;
                EVar5 = RAInstBuilder::addCallArg(ib,(RAWorkReg *)local_48,uVar6 >> 0x10 & 0xff);
                if (EVar5 == 0) goto LAB_00148473;
              }
              else {
                EVar5 = 3;
              }
LAB_001484a1:
              if ((local_49 & 1) != 0) {
                return EVar5;
              }
              goto LAB_001484ac;
            }
            if ((uVar6 >> 8 & 1) != 0) {
              if (0x1fffffff < uVar6) {
                uStack_60 = 0x1485f6;
                onInvoke();
                return 0x1e;
              }
              vReg_00 = local_48;
              if (((*(uint *)(_archTraits + (ulong)(uVar6 >> 0x18) * 4 + 0xec) ^
                   *(uint *)((long)local_48 + 0x20)) & 0xf00) == 0) goto LAB_00148461;
            }
          }
        }
LAB_00148473:
        lVar12 = lVar12 + 4;
      } while (lVar12 != 0x10);
      uVar8 = uVar8 + 1;
      out = out + 2;
      puVar11 = puVar11 + 0x40;
      bVar13 = uVar8 < local_38;
      unaff_R15 = 0x10;
    } while (uVar8 != local_38);
  }
LAB_001484ac:
  unaff_R15 = 199;
  uVar8 = 0xffffff00;
  out = &local_48;
  puVar11 = _archTraits;
  do {
    uVar6 = *(uint *)(&invokeNode->field_0x45 + unaff_R15);
    if (uVar6 == 0) break;
    if (((uVar6 & 0xff000000) != 0x16000000) &&
       ((*(uint *)(&invokeNode->super_InstNodeWithOperands<4U> + unaff_R15 * 4) & 7) == 1)) {
      this = *(RACFGBuilder **)local_40;
      uVar7 = *(int *)(&invokeNode->field_0x4 + unaff_R15 * 4) - 0x100;
      pBVar2 = (((BaseRAPass *)this)->super_FuncPass).super_Pass._cb;
      if (*(uint *)&pBVar2[1].super_BaseEmitter._logger <= uVar7) {
        return 0x1e;
      }
      vReg_00 = (&(pBVar2[1].super_BaseEmitter._code)->_environment)[uVar7];
      local_48 = *(Environment *)((long)vReg_00 + 0x28);
      if (local_48 == (Environment)0x0) {
        uStack_60 = 0x148536;
        EVar5 = BaseRAPass::_asWorkReg((BaseRAPass *)this,(VirtReg *)vReg_00,(RAWorkReg **)out);
        if (EVar5 != 0) {
          return EVar5;
        }
        uVar6 = *(uint *)(&invokeNode->field_0x45 + unaff_R15);
      }
      if ((uVar6 >> 8 & 1) == 0) {
        return 0x19;
      }
      if (0x1fffffff < uVar6) {
        uStack_60 = 0x148602;
        onInvoke();
LAB_00148602:
        uStack_60 = 0x148607;
        onInvoke();
        p_Var3 = (((BaseRAPass *)this)->super_FuncPass).super_Pass._vptr_Pass[0x13];
        bVar1 = *(byte *)((long)vReg_00 + 0x12);
        ((((BaseRAPass *)this)->super_FuncPass).super_Pass._cb)->_cursor = *(BaseNode **)vReg_00;
        if (bVar1 != 0) {
          lVar12 = 0;
          pRStack_88 = ib;
          pEStack_80 = out;
          puStack_78 = puVar11;
          pIStack_70 = invokeNode;
          lStack_68 = unaff_R15;
          uStack_60 = uVar8;
          do {
            if (lVar12 == 0x10) {
              onBeforeRet();
              return 0x1e;
            }
            if ((((*(uint *)((long)((long)vReg_00 + 0x40) + lVar12 * 4) & 7) == 1) &&
                (p_Var3[lVar12 + 0xc3] == (_func_int)0x16)) &&
               (uVar6 = *(int *)((long)vReg_00 + 0x44 + lVar12 * 4) - 0x100, uVar6 < 0xfffffeff)) {
              this_00 = (BaseRAPass *)(((BaseRAPass *)this)->super_FuncPass).super_Pass._vptr_Pass;
              pBVar2 = (this_00->super_FuncPass).super_Pass._cb;
              if (*(uint *)&pBVar2[1].super_BaseEmitter._logger <= uVar6) {
                return 0x1e;
              }
              vReg = (&(pBVar2[1].super_BaseEmitter._code)->_environment)[uVar6];
              pRStack_b8 = *(RAWorkReg **)((long)vReg + 0x28);
              if ((pRStack_b8 == (RAWorkReg *)0x0) &&
                 (EVar5 = BaseRAPass::_asWorkReg(this_00,(VirtReg *)vReg,&pRStack_b8), EVar5 != 0))
              {
                return EVar5;
              }
              OStack_b0._signature._bits = *(uint32_t *)(pRStack_b8 + 0x20);
              if ((OStack_b0._signature._bits & 0xf00) != 0x100) {
                return 0x19;
              }
              OStack_b0._baseId = *(uint32_t *)(pRStack_b8 + 4);
              OStack_b0._data[0] = 0;
              OStack_b0._data[1] = 0;
              OStack_a0._signature._bits = 2;
              OStack_a0._baseId = 0;
              OStack_a0._data[0] = 0;
              OStack_a0._data[1] = 0;
              uVar6 = *(uint *)(p_Var3 + lVar12 + 0xc0);
              uVar7 = (uint)(byte)TypeUtils::_typeData[*(byte *)(*(long *)(pRStack_b8 + 8) + 0xd)];
              if ((char)uVar6 != '\0') {
                uVar7 = uVar6;
              }
              if ((char)uVar7 == '+') {
                EVar5 = BaseRAPass::useTemporaryMem
                                  ((BaseRAPass *)
                                   (((BaseRAPass *)this)->super_FuncPass).super_Pass._vptr_Pass,
                                   (BaseMem *)&OStack_a0,8,4);
                if (EVar5 != 0) {
                  return EVar5;
                }
                OStack_a0._signature._bits._3_1_ = 8;
                IVar9 = 0x4c1;
                if (((BaseRAPass *)this)->field_0x292 == '\0') {
                  IVar9 = 0x1d6;
                }
                EVar5 = BaseEmitter::_emitI(&((((BaseRAPass *)this)->super_FuncPass).super_Pass._cb)
                                             ->super_BaseEmitter,IVar9,&OStack_a0,&OStack_b0);
                if (EVar5 != 0) {
                  return EVar5;
                }
                EVar5 = BaseEmitter::_emitI(&((((BaseRAPass *)this)->super_FuncPass).super_Pass._cb)
                                             ->super_BaseEmitter,0xe2,&OStack_a0);
              }
              else {
                if ((uVar7 & 0xff) != 0x2a) {
                  return 0x19;
                }
                EVar5 = BaseRAPass::useTemporaryMem
                                  ((BaseRAPass *)
                                   (((BaseRAPass *)this)->super_FuncPass).super_Pass._vptr_Pass,
                                   (BaseMem *)&OStack_a0,4,4);
                if (EVar5 != 0) {
                  return EVar5;
                }
                OStack_a0._signature._bits._3_1_ = 4;
                IVar9 = 0x4c5;
                if (((BaseRAPass *)this)->field_0x292 == '\0') {
                  IVar9 = 0x1d9;
                }
                EVar5 = BaseEmitter::_emitI(&((((BaseRAPass *)this)->super_FuncPass).super_Pass._cb)
                                             ->super_BaseEmitter,IVar9,&OStack_a0,&OStack_b0);
                if (EVar5 != 0) {
                  return EVar5;
                }
                EVar5 = BaseEmitter::_emitI(&((((BaseRAPass *)this)->super_FuncPass).super_Pass._cb)
                                             ->super_BaseEmitter,0xe2,&OStack_a0);
              }
              if (EVar5 != 0) {
                return EVar5;
              }
            }
            lVar12 = lVar12 + 4;
          } while ((ulong)bVar1 * 4 != lVar12);
        }
        return 0;
      }
      if (((*(uint *)(_archTraits + (ulong)(uVar6 >> 0x18) * 4 + 0xec) ^
           *(uint *)((long)local_48 + 0x20)) & 0xf00) == 0) {
        uStack_60 = 0x148583;
        EVar5 = RAInstBuilder::addCallRet(ib,(RAWorkReg *)local_48,uVar6 >> 0x10 & 0xff);
        if (EVar5 != 0) {
          return EVar5;
        }
      }
    }
    unaff_R15 = unaff_R15 + 4;
  } while (unaff_R15 != 0xd7);
  lVar12 = *(long *)local_40;
  lVar10 = 0;
  do {
    *(uint *)(ib + lVar10 * 4 + 0x28) =
         ~((uint)(-1L << (*(byte *)(lVar12 + 0x10c + lVar10) & 0x3f)) |
          *(uint *)(&invokeNode->field_0xa4 + lVar10 * 4));
    lVar10 = lVar10 + 1;
  } while (lVar10 != 4);
  return 0;
}

Assistant:

Error RACFGBuilder::onInvoke(InvokeNode* invokeNode, RAInstBuilder& ib) noexcept {
  uint32_t argCount = invokeNode->argCount();
  const FuncDetail& fd = invokeNode->detail();

  for (uint32_t argIndex = 0; argIndex < argCount; argIndex++) {
    const FuncValuePack& argPack = fd.argPack(argIndex);
    for (uint32_t valueIndex = 0; valueIndex < Globals::kMaxValuePack; valueIndex++) {
      if (!argPack[valueIndex])
        continue;

      const FuncValue& arg = argPack[valueIndex];
      const Operand& op = invokeNode->arg(argIndex, valueIndex);

      if (op.isNone())
        continue;

      if (op.isReg()) {
        const Reg& reg = op.as<Reg>();
        RAWorkReg* workReg;
        ASMJIT_PROPAGATE(_pass->virtIndexAsWorkReg(Operand::virtIdToIndex(reg.id()), &workReg));

        if (arg.isIndirect()) {
          RegGroup regGroup = workReg->group();
          if (regGroup != RegGroup::kGp)
            return DebugUtils::errored(kErrorInvalidState);
          ASMJIT_PROPAGATE(ib.addCallArg(workReg, arg.regId()));
        }
        else if (arg.isReg()) {
          RegGroup regGroup = workReg->group();
          RegGroup argGroup = Reg::groupOf(arg.regType());

          if (regGroup == argGroup) {
            ASMJIT_PROPAGATE(ib.addCallArg(workReg, arg.regId()));
          }
        }
      }
    }
  }

  for (uint32_t retIndex = 0; retIndex < Globals::kMaxValuePack; retIndex++) {
    const FuncValue& ret = fd.ret(retIndex);
    if (!ret)
      break;

    // Not handled here...
    const Operand& op = invokeNode->ret(retIndex);
    if (ret.regType() == RegType::kX86_St)
      continue;

    if (op.isReg()) {
      const Reg& reg = op.as<Reg>();
      RAWorkReg* workReg;
      ASMJIT_PROPAGATE(_pass->virtIndexAsWorkReg(Operand::virtIdToIndex(reg.id()), &workReg));

      if (ret.isReg()) {
        RegGroup regGroup = workReg->group();
        RegGroup retGroup = Reg::groupOf(ret.regType());

        if (regGroup == retGroup) {
          ASMJIT_PROPAGATE(ib.addCallRet(workReg, ret.regId()));
        }
      }
      else {
        return DebugUtils::errored(kErrorInvalidAssignment);
      }
    }
  }

  // Setup clobbered registers.
  for (RegGroup group : RegGroupVirtValues{})
    ib._clobbered[group] = Support::lsbMask<RegMask>(_pass->_physRegCount[group]) & ~fd.preservedRegs(group);

  return kErrorOk;
}